

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# suffix_array.hpp
# Opt level: O0

void __thiscall
suffix_array<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_unsigned_long,_true>
::suffix_array(suffix_array<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_unsigned_long,_true>
               *this,__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     begin,
              __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              end,comm *_comm)

{
  int iVar1;
  int rank;
  size_t sVar2;
  unsigned_long uVar3;
  runtime_error *this_00;
  block_decomposition_buffered<unsigned_long> local_88;
  suffix_array<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_unsigned_long,_true>
  *local_48;
  char *local_40;
  comm *local_28;
  comm *_comm_local;
  suffix_array<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_unsigned_long,_true>
  *this_local;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  end_local;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  begin_local;
  
  this->_vptr_suffix_array = (_func_int **)&PTR__suffix_array_001f3878;
  local_28 = _comm;
  _comm_local = (comm *)this;
  this_local = (suffix_array<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_unsigned_long,_true>
                *)end._M_current;
  end_local = begin;
  mxx::comm::copy(&this->comm,(EVP_PKEY_CTX *)_comm,(EVP_PKEY_CTX *)end._M_current);
  iVar1 = mxx::comm::size(&this->comm);
  this->p = iVar1;
  (this->input_begin)._M_current = end_local._M_current;
  (this->input_end)._M_current = (char *)this_local;
  mxx::partition::block_decomposition_buffered<unsigned_long>::block_decomposition_buffered
            (&this->part);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&this->local_SA);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&this->local_B);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&this->local_LCP);
  local_40 = end_local._M_current;
  local_48 = this_local;
  sVar2 = std::distance<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                    (end_local,
                     (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      )this_local);
  this->local_size = sVar2;
  uVar3 = mxx::allreduce<unsigned_long>(&this->local_size,&this->comm);
  this->n = uVar3;
  uVar3 = this->n;
  iVar1 = mxx::comm::size(&this->comm);
  rank = mxx::comm::rank(&this->comm);
  mxx::partition::block_decomposition_buffered<unsigned_long>::block_decomposition_buffered
            (&local_88,uVar3,iVar1,rank);
  mxx::partition::block_decomposition_buffered<unsigned_long>::operator=(&this->part,&local_88);
  mxx::partition::block_decomposition_buffered<unsigned_long>::~block_decomposition_buffered
            (&local_88);
  uVar3 = mxx::partition::block_decomposition_buffered<unsigned_long>::local_size(&this->part);
  if (uVar3 != this->local_size) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (this_00,
               "The input string must be equally block decomposed accross all MPI processes.");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  return;
}

Assistant:

suffix_array(InputIterator begin, InputIterator end, const mxx::comm& _comm)
        : comm(_comm.copy()), p(comm.size()),
        input_begin(begin), input_end(end)
    {
        // the local size of the input
        local_size = std::distance(begin, end);
        n = mxx::allreduce(local_size, this->comm);
        // get distribution
        part = mxx::partition::block_decomposition_buffered<index_t>(n, comm.size(), comm.rank());

        // assert a block decomposition
        if (part.local_size() != local_size)
            throw std::runtime_error("The input string must be equally block decomposed accross all MPI processes.");

        // get MPI type
        //mpi_index_t = index_mpi_dt.type();
    }